

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemTaskTests.cpp
# Opt level: O1

void __thiscall
BuildSystemTaskTests_dirContentsHandleUpstreamFailure_Test::TestBody
          (BuildSystemTaskTests_dirContentsHandleUpstreamFailure_Test *this)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  long *plVar3;
  undefined1 uVar4;
  bool bVar5;
  raw_ostream *prVar6;
  char *__s;
  size_t sVar7;
  long lVar8;
  int line;
  Child *EC;
  ulong uVar9;
  pointer *__ptr;
  internal iVar10;
  char *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  StringRef namePrefix;
  StringRef Filename;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef path;
  StringRef mainFilename;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar__2;
  BuildSystem system;
  unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_> localFS;
  BuildKey keyToBuild;
  MockBuildSystemDelegate delegate;
  AssertionResult gtest_ar_;
  SmallString<256U> manifest;
  SmallString<256U> outputDir;
  SmallString<256U> fakeDir;
  SmallString<256U> builddb;
  TmpDir tempDir;
  AssertHelper local_718;
  Child local_710;
  Child local_708;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_700;
  undefined1 local_6f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6e8;
  BuildSystem local_6d8;
  long *local_6d0;
  AssertHelper local_6c8;
  _Head_base<0UL,_llbuild::basic::FileSystem_*,_false> local_6c0;
  Child local_6b8;
  long local_6b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6a8;
  Child local_698;
  long local_690;
  undefined1 local_688;
  undefined7 uStack_687;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_668 [2];
  ExecutionQueueDelegate local_628 [2];
  Child local_618;
  Child local_610;
  anon_union_80_2_ecfed234_for_valueData local_608;
  internal local_5a8;
  long *local_5a0 [2];
  long local_590 [2];
  Child local_580;
  undefined4 local_578;
  undefined4 uStack_574;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_570 [16];
  Child local_470;
  ulong local_468;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_460 [16];
  Child local_360;
  ulong local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350 [16];
  SmallString<256U> local_250;
  TmpDir local_140;
  
  namePrefix.Length = 8;
  namePrefix.Data = "TestBody";
  llbuild::TmpDir::TmpDir(&local_140,namePrefix);
  llbuild::basic::createLocalFileSystem();
  llbuild::TmpDir::str_abi_cxx11_((string *)&local_470,&local_140);
  local_250.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX =
       &local_250.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>;
  local_250.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_250.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x100;
  llvm::SmallVectorImpl<char>::append<char_const*,void>
            ((SmallVectorImpl<char> *)&local_250,local_470.cString,
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&(local_470.twine)->LHS)->_M_local_buf + local_468);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470.twine != local_460) {
    operator_delete(local_470.twine,local_460[0]._M_allocated_capacity + 1);
  }
  llvm::Twine::Twine((Twine *)&local_470,"build.db");
  llvm::Twine::Twine((Twine *)&local_360,"");
  llvm::Twine::Twine((Twine *)&local_580,"");
  llvm::Twine::Twine((Twine *)&local_698,"");
  llvm::sys::path::append
            ((SmallVectorImpl<char> *)&local_250,(Twine *)&local_470,(Twine *)&local_360,
             (Twine *)&local_580,(Twine *)&local_698);
  if ((local_250.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
       super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
       super_SmallVectorBase._8_8_ & 0xffffffff) != 0) {
    uVar9 = 0;
    do {
      if (((AlignedCharArrayUnion<char,_char,_char,_char,_char,_char,_char,_char,_char,_char> *)
          local_250.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
          super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
          super_SmallVectorBase.BeginX)[uVar9].super_AlignedCharArray<1UL,_1UL>.buffer[0] == '\\') {
        ((AlignedCharArrayUnion<char,_char,_char,_char,_char,_char,_char,_char,_char,_char> *)
        local_250.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
        super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
        super_SmallVectorBase.BeginX)[uVar9].super_AlignedCharArray<1UL,_1UL>.buffer[0] = '/';
      }
      uVar9 = uVar9 + 1;
    } while ((local_250.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
              super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
              super_SmallVectorBase._8_8_ & 0xffffffff) != uVar9);
  }
  llbuild::TmpDir::str_abi_cxx11_((string *)&local_360,&local_140);
  local_470.twine = (Twine *)local_460;
  local_468 = 0x10000000000;
  llvm::SmallVectorImpl<char>::append<char_const*,void>
            ((SmallVectorImpl<char> *)&local_470,local_360.cString,
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&(local_360.twine)->LHS)->_M_local_buf + local_358);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360.twine != local_350) {
    operator_delete(local_360.twine,local_350[0]._M_allocated_capacity + 1);
  }
  llvm::Twine::Twine((Twine *)&local_360,"output");
  llvm::Twine::Twine((Twine *)&local_580,"");
  llvm::Twine::Twine((Twine *)&local_698,"");
  llvm::Twine::Twine((Twine *)&local_618,"");
  llvm::sys::path::append
            ((SmallVectorImpl<char> *)&local_470,(Twine *)&local_360,(Twine *)&local_580,
             (Twine *)&local_698,(Twine *)&local_618);
  if ((local_468 & 0xffffffff) != 0) {
    uVar9 = 0;
    do {
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)&(local_470.twine)->LHS)->_M_local_buf[uVar9] == '\\') {
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)&(local_470.twine)->LHS)->_M_local_buf[uVar9] = '/';
      }
      uVar9 = uVar9 + 1;
    } while ((local_468 & 0xffffffff) != uVar9);
  }
  llbuild::TmpDir::str_abi_cxx11_((string *)&local_580,&local_140);
  local_360.twine = (Twine *)local_350;
  local_358 = 0x10000000000;
  llvm::SmallVectorImpl<char>::append<char_const*,void>
            ((SmallVectorImpl<char> *)&local_360,local_580.cString,
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&(local_580.twine)->LHS)->_M_local_buf + CONCAT44(uStack_574,local_578));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580.twine != local_570) {
    operator_delete(local_580.twine,
                    CONCAT71(local_570[0]._M_allocated_capacity._1_7_,local_570[0]._M_local_buf[0])
                    + 1);
  }
  llvm::Twine::Twine((Twine *)&local_580,"fake");
  llvm::Twine::Twine((Twine *)&local_698,"");
  llvm::Twine::Twine((Twine *)&local_618,"");
  llvm::Twine::Twine((Twine *)&local_6b8,"");
  llvm::sys::path::append
            ((SmallVectorImpl<char> *)&local_360,(Twine *)&local_580,(Twine *)&local_698,
             (Twine *)&local_618,(Twine *)&local_6b8);
  plVar3 = local_6d0;
  if ((local_358 & 0xffffffff) != 0) {
    uVar9 = 0;
    do {
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)&(local_360.twine)->LHS)->_M_local_buf[uVar9] == '\\') {
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)&(local_360.twine)->LHS)->_M_local_buf[uVar9] = '/';
      }
      uVar9 = uVar9 + 1;
    } while ((local_358 & 0xffffffff) != uVar9);
  }
  local_580.twine = (Twine *)local_570;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360.twine ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    local_578 = 0;
    uStack_574 = 0;
    local_570[0]._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_580,local_360.twine,
               (long)&(local_360.twine)->LHS + (local_358 & 0xffffffff));
  }
  local_698.twine = (Twine *)&local_688;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470.twine ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    local_690 = 0;
    local_688 = 0;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_698,local_470.twine,
               (long)&(local_470.twine)->LHS + (local_468 & 0xffffffff));
  }
  uVar4 = (**(code **)(*plVar3 + 0x48))(plVar3,&local_580,&local_698);
  local_618.character = uVar4;
  local_610.twine = (Twine *)0x0;
  if (local_698.twine != (Twine *)&local_688) {
    operator_delete(local_698.twine,CONCAT71(uStack_687,local_688) + 1);
  }
  if (local_580.twine != (Twine *)local_570) {
    operator_delete(local_580.twine,
                    CONCAT71(local_570[0]._M_allocated_capacity._1_7_,local_570[0]._M_local_buf[0])
                    + 1);
  }
  if (local_618.character == '\0') {
    testing::Message::Message((Message *)&local_698);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_580,(internal *)&local_618.character,
               (AssertionResult *)"localFS->createSymlink(fakeDir.str(), outputDir.str())","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_6b8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
               ,0x51b,local_580.cString);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_6b8,(Message *)&local_698);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_6b8);
    if (local_580.twine != (Twine *)local_570) {
      operator_delete(local_580.twine,
                      CONCAT71(local_570[0]._M_allocated_capacity._1_7_,local_570[0]._M_local_buf[0]
                              ) + 1);
    }
    if (local_698.twine != (Twine *)0x0) {
      (**(code **)((undefined *)*local_698.decUL + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_610.twine !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_610.character,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_610.twine);
    }
    goto LAB_00128f09;
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_610.twine !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_610.character,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_610.twine);
  }
  llbuild::TmpDir::str_abi_cxx11_((string *)&local_698,&local_140);
  local_578 = 0;
  uStack_574 = 0x100;
  local_580.twine = (Twine *)local_570;
  llvm::SmallVectorImpl<char>::append<char_const*,void>
            ((SmallVectorImpl<char> *)&local_580,local_698.cString,
             (char *)((long)&(local_698.twine)->LHS + local_690));
  if (local_698.twine != (Twine *)&local_688) {
    operator_delete(local_698.twine,CONCAT71(uStack_687,local_688) + 1);
  }
  llvm::Twine::Twine((Twine *)&local_698,"manifest.llbuild");
  llvm::Twine::Twine((Twine *)&local_618,"");
  llvm::Twine::Twine((Twine *)&local_6b8,"");
  llvm::Twine::Twine((Twine *)&local_710,"");
  llvm::sys::path::append
            ((SmallVectorImpl<char> *)&local_580,(Twine *)&local_698,(Twine *)&local_618,
             (Twine *)&local_6b8,(Twine *)&local_710);
  local_618.decUI = 0;
  local_610.twine = (Twine *)std::_V2::system_category();
  Filename.Length._0_4_ = local_578;
  Filename.Data = local_580.cString;
  EC = &local_618;
  Filename.Length._4_4_ = 0;
  llvm::raw_fd_ostream::raw_fd_ostream
            ((raw_fd_ostream *)&local_698,Filename,(error_code *)EC,F_Text);
  if (local_618.decUI != 0) {
    __assert_fail("!ec",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                  ,0x524,
                  "virtual void BuildSystemTaskTests_dirContentsHandleUpstreamFailure_Test::TestBody()"
                 );
  }
  Str.Length = 0x3a;
  Str.Data = "client:\n  name: mock\n\ntargets:\n  \"\": [\"<all>\"]\n\nnodes:\n  \"";
  prVar6 = llvm::raw_ostream::operator<<((raw_ostream *)&local_698,Str);
  prVar6 = (raw_ostream *)
           llvm::raw_ostream::write
                     (prVar6,local_470.decI,(void *)(local_468 & 0xffffffff),(size_t)EC);
  Str_00.Length = 0x42;
  Str_00.Data = "\": {}\n\ncommands:\n  \"mkdir-output\":\n    tool: mkdir\n    outputs: [\"";
  prVar6 = llvm::raw_ostream::operator<<(prVar6,Str_00);
  prVar6 = (raw_ostream *)
           llvm::raw_ostream::write
                     (prVar6,local_470.decI,(void *)(local_468 & 0xffffffff),(size_t)EC);
  Str_01.Length = 0x4c;
  Str_01.Data = 
  "\"]\n    description: \"mkdir-output\"\n  \"<all>\":\n    tool: phony\n    inputs: [\"";
  prVar6 = llvm::raw_ostream::operator<<(prVar6,Str_01);
  prVar6 = (raw_ostream *)
           llvm::raw_ostream::write
                     (prVar6,local_470.decI,(void *)(local_468 & 0xffffffff),(size_t)EC);
  Str_02.Length = 0x1b;
  Str_02.Data = "/\"]\n    outputs: [\"<all>\"]\n";
  llvm::raw_ostream::operator<<(prVar6,Str_02);
  llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)&local_698);
  llbuild::buildsystem::BuildKey::BuildKey((BuildKey *)&local_6b8,'T',(StringRef)ZEXT816(0x209faf));
  llbuild::unittests::MockBuildSystemDelegate::MockBuildSystemDelegate
            ((MockBuildSystemDelegate *)&local_698,false);
  llbuild::basic::createLocalFileSystem();
  llbuild::buildsystem::BuildSystem::BuildSystem
            (&local_6d8,(BuildSystemDelegate *)&local_698,
             (unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
              *)&local_6c0);
  if (local_6c0._M_head_impl != (FileSystem *)0x0) {
    (*(local_6c0._M_head_impl)->_vptr_FileSystem[1])();
  }
  local_6c0._M_head_impl = (FileSystem *)0x0;
  __s = llvm::SmallString<256U>::c_str(&local_250);
  if (__s == (char *)0x0) {
    sVar7 = 0;
  }
  else {
    sVar7 = strlen(__s);
  }
  path.Length = sVar7;
  path.Data = __s;
  llbuild::buildsystem::BuildSystem::attachDB(&local_6d8,path,(string *)0x0);
  mainFilename.Length._0_4_ = local_578;
  mainFilename.Data = local_580.cString;
  mainFilename.Length._4_4_ = 0;
  bVar5 = llbuild::buildsystem::BuildSystem::loadDescription(&local_6d8,mainFilename);
  local_710.character = bVar5;
  local_708.twine = (Twine *)0x0;
  if (bVar5) {
    local_5a0[0] = local_590;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_5a0,local_6b8.twine,(long)&(local_6b8.twine)->LHS + local_6b0);
    llbuild::buildsystem::BuildSystem::build
              ((Optional<llbuild::buildsystem::BuildValue> *)&local_618,&local_6d8,
               (BuildKey *)local_5a0);
    if (local_5a0[0] != local_590) {
      operator_delete(local_5a0[0],local_590[0] + 1);
    }
    local_6f0[0] = local_5a8;
    local_6e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_5a8 == (internal)0x0) {
      testing::Message::Message((Message *)&local_718);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&local_710,(internal *)local_6f0,(AssertionResult *)"result.hasValue()",
                 "false","true",in_R9);
      line = 0x545;
LAB_00128e2d:
      testing::internal::AssertHelper::AssertHelper
                (&local_6c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                 ,line,local_710.cString);
      testing::internal::AssertHelper::operator=(&local_6c8,(Message *)&local_718);
      testing::internal::AssertHelper::~AssertHelper(&local_6c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_710.twine != &local_700) {
        operator_delete(local_710.twine,local_700._M_allocated_capacity + 1);
      }
      if (local_718.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_718.data_ + 8))();
      }
    }
    else {
      llbuild::unittests::MockBuildSystemDelegate::getMessages_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_6f0,(MockBuildSystemDelegate *)&local_698);
      pbVar2 = local_6e8;
      pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT71(local_6f0._1_7_,local_6f0[0]);
      if (pbVar11 == local_6e8) {
        iVar10 = (internal)0x0;
      }
      else {
        do {
          pcVar1 = (pbVar11->_M_dataplus)._M_p;
          local_710.twine = (Twine *)&local_700;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_710,pcVar1,pcVar1 + pbVar11->_M_string_length);
          lVar8 = std::__cxx11::string::find(&local_710.character,0x1f7a6d,0);
          if (lVar8 != -1) {
            if (local_710.twine != (Twine *)&local_700) {
              operator_delete(local_710.twine,local_700._M_allocated_capacity + 1);
            }
            iVar10 = (internal)0x1;
            goto LAB_00128dbe;
          }
          if (local_710.twine != (Twine *)&local_700) {
            operator_delete(local_710.twine,local_700._M_allocated_capacity + 1);
          }
          pbVar11 = pbVar11 + 1;
        } while (pbVar11 != pbVar2);
        iVar10 = (internal)0x0;
      }
LAB_00128dbe:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_6f0);
      local_6e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_6f0[0] = iVar10;
      if (iVar10 == (internal)0x0) {
        testing::Message::Message((Message *)&local_718);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&local_710,(internal *)local_6f0,(AssertionResult *)0x20f617,"false",
                   "true",in_R9);
        line = 0x54f;
        goto LAB_00128e2d;
      }
    }
    if (local_6e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_6e8,local_6e8);
    }
    if (local_5a8 == (internal)0x1) {
      llbuild::buildsystem::BuildValue::~BuildValue((BuildValue *)&local_618);
      local_5a8 = (internal)0x0;
    }
  }
  else {
    testing::Message::Message((Message *)local_6f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_618,(internal *)&local_710.character,
               (AssertionResult *)"loadingResult","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_718,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
               ,0x541,(char *)CONCAT44(local_618._4_4_,local_618.decUI));
    testing::internal::AssertHelper::operator=(&local_718,(Message *)local_6f0);
    testing::internal::AssertHelper::~AssertHelper(&local_718);
    if ((anon_union_80_2_ecfed234_for_valueData *)CONCAT44(local_618._4_4_,local_618.decUI) !=
        &local_608) {
      operator_delete((anon_union_80_2_ecfed234_for_valueData *)
                      CONCAT44(local_618._4_4_,local_618.decUI),
                      (ulong)(local_608.asOutputInfo.device + 1));
    }
    if ((long *)CONCAT71(local_6f0._1_7_,local_6f0[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_6f0._1_7_,local_6f0[0]) + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_708.twine !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_708.character,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_708.twine);
    }
  }
  llbuild::buildsystem::BuildSystem::~BuildSystem(&local_6d8);
  local_698.twine = (Twine *)&PTR__MockBuildSystemDelegate_002554b0;
  llbuild::basic::ExecutionQueueDelegate::~ExecutionQueueDelegate(local_628);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_668);
  llbuild::buildsystem::BuildSystemDelegate::~BuildSystemDelegate((BuildSystemDelegate *)&local_698)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8.twine != &local_6a8) {
    operator_delete(local_6b8.twine,local_6a8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580.twine != local_570) {
    free(local_580.twine);
  }
LAB_00128f09:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360.twine != local_350) {
    free(local_360.twine);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470.twine != local_460) {
    free(local_470.twine);
  }
  if ((SmallVectorStorage<char,_256U> *)
      local_250.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
      super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.BeginX !=
      &local_250.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>) {
    free(local_250.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
         super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
         super_SmallVectorBase.BeginX);
  }
  if (local_6d0 != (long *)0x0) {
    (**(code **)(*local_6d0 + 8))();
  }
  llbuild::TmpDir::~TmpDir(&local_140);
  return;
}

Assistant:

TEST(BuildSystemTaskTests, dirContentsHandleUpstreamFailure) {
  TmpDir tempDir(__func__);
  auto localFS = createLocalFileSystem();

  SmallString<256> builddb{ tempDir.str() };
  sys::path::append(builddb, "build.db");
  for (auto& c : builddb) {
    if (c == '\\')
      c = '/';
  }

  SmallString<256> outputDir{ tempDir.str() };
  sys::path::append(outputDir, "output");
  for (auto& c : outputDir) {
    if (c == '\\')
      c = '/';
  }
  SmallString<256> fakeDir{ tempDir.str() };
  sys::path::append(fakeDir, "fake");
  for (auto& c : fakeDir) {
    if (c == '\\')
      c = '/';
  }

  // Write `output` as a symlink to something that doesn't exist
  ASSERT_TRUE(localFS->createSymlink(fakeDir.str(), outputDir.str()));

  // Build with a mkdir rule
  {
    SmallString<256> manifest{ tempDir.str() };
    sys::path::append(manifest, "manifest.llbuild");
    {
      std::error_code ec;
      llvm::raw_fd_ostream os(manifest, ec, llvm::sys::fs::F_Text);
      assert(!ec);

      os <<
      "client:\n"
      "  name: mock\n"
      "\n"
      "targets:\n"
      "  \"\": [\"<all>\"]\n"
      "\n"
      "nodes:\n"
      "  \"" << outputDir << "\": {}\n"
      "\n"
      "commands:\n"
      "  \"mkdir-output\":\n"
      "    tool: mkdir\n"
      "    outputs: [\"" << outputDir << "\"]\n"
      "    description: \"mkdir-output\"\n"
      "  \"<all>\":\n"
      "    tool: phony\n"
      "    inputs: [\"" << outputDir << "/\"]\n"
      "    outputs: [\"<all>\"]\n";
    }

    // Create the build system.
    auto keyToBuild = BuildKey::makeTarget("");
    MockBuildSystemDelegate delegate;
    BuildSystem system(delegate, createLocalFileSystem());
    system.attachDB(builddb.c_str(), nullptr);
    bool loadingResult = system.loadDescription(manifest);
    ASSERT_TRUE(loadingResult);

    // Build a specific key.
    auto result = system.build(keyToBuild);
    ASSERT_TRUE(result.hasValue());

    // Ensure that we have not had any missing inputs
    bool found = false;
    for (auto message : delegate.getMessages()) {
      if (message.find("unable to create directory") != std::string::npos) {
        found = true;
        break;
      }
    }
    ASSERT_TRUE(found);
  }
}